

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O0

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_>_>
::AddAllUnbridged(ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_>_>
                  *this,BasicFlatModelAPI *be,ItemNamer *vnam)

{
  int iVar1;
  LinkEntry be_00;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *pFVar6;
  ValuePresolver *this_00;
  ModelValuesTerminal *this_01;
  ValueNode *in_RSI;
  ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_>_>
  *in_RDI;
  NodeRange NVar7;
  NodeRange NVar8;
  bool adding;
  value_type *cont;
  int con_group;
  int in_stack_0000012c;
  ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&> *in_stack_00000130;
  undefined1 in_stack_00000567;
  ItemNamer *in_stack_00000568;
  Container *in_stack_00000570;
  int in_stack_0000057c;
  ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_>_>
  *in_stack_00000580;
  ValueNode *in_stack_ffffffffffffff48;
  NodeIndexRange in_stack_ffffffffffffff50;
  ValueNode *in_stack_ffffffffffffff58;
  NodeIndexRange in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff6c;
  ValueNode *pVVar9;
  ValueNode *in_stack_ffffffffffffffb0;
  NodeIndexRange in_stack_ffffffffffffffb8;
  ValueNode *local_40;
  NodeIndexRange local_38;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar3 = GetConstraintGroup((ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_>_>
                              *)in_stack_ffffffffffffff50,
                             (BasicFlatModelAPI *)in_stack_ffffffffffffff48);
  while( true ) {
    iVar1 = in_RDI->i_2add_next_;
    sVar4 = std::
            deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_>_>::Container>_>
            ::size((deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_>_>::Container>_>
                    *)0x37f82b);
    if ((int)sVar4 <= iVar1) break;
    pvVar5 = std::
             deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_>_>::Container>_>
             ::operator[]((deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_>_>::Container>_>
                           *)in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
    bVar2 = Container::IsRedundant((Container *)in_stack_ffffffffffffff50);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      pVVar9 = in_RSI;
      Container::GetCon((Container *)0x37f89d);
      BasicFlatModelAPI::
      AddConstraint<mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>>>
                ((BasicFlatModelAPI *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),
                 (ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_> *)pvVar5);
      pFVar6 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                *)GetConverter(in_RDI);
      FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ::GetCopyLink(pFVar6);
      BasicConstraintKeeper::GetValueNode(&in_RDI->super_BasicConstraintKeeper);
      NVar7 = pre::ValueNode::Select
                        ((ValueNode *)in_stack_ffffffffffffff60,
                         (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                         (int)in_stack_ffffffffffffff58);
      pFVar6 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                *)GetConverter(in_RDI);
      this_00 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                ::GetValuePresolver(pFVar6);
      this_01 = pre::ValuePresolverImpl::GetTargetNodes(&this_00->super_ValuePresolverImpl);
      pre::ModelValues<mp::pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>_>::
      GetConValues(this_01);
      pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>::operator()
                (in_stack_00000130,in_stack_0000012c);
      NVar8 = pre::ValueNode::Add(pVVar9,in_stack_ffffffffffffff6c);
      pVVar9 = NVar8.pvn_;
      in_stack_ffffffffffffff48 = in_stack_ffffffffffffffb0;
      in_stack_ffffffffffffff50 = in_stack_ffffffffffffffb8;
      std::pair<mp::pre::NodeRange,_mp::pre::NodeRange>::
      pair<mp::pre::NodeRange,_mp::pre::NodeRange,_true>
                ((pair<mp::pre::NodeRange,_mp::pre::NodeRange> *)&stack0xffffffffffffffb0,
                 (NodeRange *)&stack0xffffffffffffffa0,(NodeRange *)&stack0xffffffffffffff90);
      be_00.second.pvn_ = in_stack_ffffffffffffff48;
      be_00.first = NVar7;
      be_00.second.ir_ = in_stack_ffffffffffffff50;
      in_stack_ffffffffffffff58 = local_40;
      in_stack_ffffffffffffff60 = local_38;
      in_stack_ffffffffffffffb0 = in_stack_ffffffffffffff48;
      in_stack_ffffffffffffffb8 = in_stack_ffffffffffffff50;
      pre::CopyLink::AddEntry((CopyLink *)pVVar9,be_00);
    }
    ExportConStatus(in_stack_00000580,in_stack_0000057c,in_stack_00000570,in_stack_00000568,
                    (bool)in_stack_00000567);
    in_RDI->i_2add_next_ = in_RDI->i_2add_next_ + 1;
  }
  return;
}

Assistant:

void AddAllUnbridged(BasicFlatModelAPI& be,
                       ItemNamer& vnam) {
    auto con_group = GetConstraintGroup(be);
		for ( ; i_2add_next_ < (int)cons_.size(); ++i_2add_next_) {
      const auto& cont = cons_[i_2add_next_];
      bool adding = !cont.IsRedundant();            // includes 'unused'
      if (adding) {
        static_cast<Backend&>(be).AddConstraint(cont.GetCon());
        GetConverter().GetCopyLink().             // Linking to the "final" nodes
            AddEntry({
                       GetValueNode().Select(i_2add_next_),
                       GetConverter().GetValuePresolver().GetTargetNodes().
                         GetConValues()(con_group).Add()
                     });
      }
      ExportConStatus(i_2add_next_, cont, vnam, adding);
    }
  }